

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  code *pcVar3;
  _func_XML_Convert_Result_ENCODING_ptr_char_ptr_ptr_char_ptr_unsigned_short_ptr_ptr_unsigned_short_ptr
  *p_Var4;
  SCANNER p_Var5;
  long *plVar6;
  XML_Convert_Result XVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined8 *puVar13;
  undefined1 *puVar14;
  long *plVar15;
  int iVar16;
  unsigned_short *in_R8;
  char **ppcVar17;
  char **ppcVar18;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  
  puVar12 = auStack_38;
  puVar14 = auStack_38;
  puVar11 = auStack_38;
  uVar8 = (long)end - (long)ptr;
  if ((long)uVar8 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  ppcVar18 = (char **)(ulong)bVar1;
  uStack_40 = 1;
  lVar9 = 1;
  lVar10 = lVar9;
  plVar6 = (long *)auStack_38;
  ppcVar17 = (char **)ptr;
  if (bVar1 == 0x18) goto LAB_0044a288;
  if (bVar1 == 6) {
    if (2 < uVar8) {
      uStack_40 = 0x44a225;
      XVar7 = (*enc[3].scanners[2])(enc,ptr,(char *)0x1,ppcVar18);
      goto LAB_0044a281;
    }
LAB_0044a210:
    *(undefined8 *)(puVar11 + -8) = 0xfffffffffffffffe;
    return (int)*(undefined8 *)(puVar11 + -8);
  }
  if (bVar1 == 7) {
    puVar11 = auStack_38;
    if (uVar8 < 4) goto LAB_0044a210;
    uStack_40 = 0x44a194;
    XVar7 = (*enc[3].literalScanners[0])(enc,ptr,(char *)0x1,ppcVar18);
LAB_0044a27a:
    plVar15 = (long *)(puVar12 + -8);
    *(undefined8 *)(puVar12 + -8) = 4;
    ppcVar17 = (char **)ptr;
    while( true ) {
      lVar10 = *plVar15;
      plVar6 = plVar15 + 1;
      if (XVar7 == XML_CONVERT_COMPLETED) break;
LAB_0044a288:
      do {
        puVar12 = (undefined1 *)plVar6;
        ppcVar17 = (char **)((long)ppcVar17 + lVar10);
        uVar8 = (long)end - (long)ppcVar17;
        if ((long)uVar8 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar17);
        lVar10 = lVar9;
        plVar6 = (long *)puVar12;
      } while (bVar1 - 0x18 < 4);
      puVar11 = puVar12;
      if (bVar1 == 5) {
        if (uVar8 == 1) goto LAB_0044a210;
        p_Var4 = enc[2].utf16Convert;
        *(undefined8 *)(puVar12 + -8) = 0x44a317;
        XVar7 = (*p_Var4)(enc,ppcVar17,(char *)0x1,(unsigned_short **)(ulong)bVar1,in_R8);
LAB_0044a276:
        plVar15 = (long *)(puVar12 + -8);
        *(undefined8 *)(puVar12 + -8) = 2;
      }
      else {
        ptr = (char *)ppcVar17;
        if (bVar1 != 6) {
          if (bVar1 == 7) {
            if (uVar8 < 4) goto LAB_0044a210;
            p_Var5 = enc[3].scanners[0];
            *(undefined8 *)(puVar12 + -8) = 0x44a333;
            XVar7 = (*p_Var5)(enc,(char *)ppcVar17,(char *)0x1,(char **)(ulong)bVar1);
            goto LAB_0044a27a;
          }
          if (bVar1 != 0x16) {
            if (bVar1 != 0x12) break;
            ppcVar18 = (char **)((long)ppcVar17 + 1);
            puVar13 = (undefined8 *)(puVar12 + -8);
            *(undefined8 *)(puVar12 + -8) = 9;
            goto LAB_0044a27e;
          }
          goto LAB_0044a288;
        }
        if (uVar8 < 3) goto LAB_0044a210;
        pcVar3 = *(code **)&enc[2].minBytesPerChar;
        *(undefined8 *)(puVar12 + -8) = 0x44a2fe;
        XVar7 = (*pcVar3)(enc,ppcVar17);
        puVar14 = puVar12;
LAB_0044a281:
        plVar15 = (long *)(puVar14 + -8);
        *(undefined8 *)(puVar14 + -8) = 3;
        ppcVar17 = (char **)ptr;
      }
    }
  }
  else if (bVar1 == 0x13) {
    ppcVar17 = (char **)(ptr + 1);
    if ((char **)end == ppcVar17 || (long)end - (long)ppcVar17 < 0) {
      return -1;
    }
    if ((ulong)*(byte *)ppcVar17 == 0x78) {
      ppcVar17 = (char **)(ptr + 2);
      if ((char **)end == ppcVar17 || (long)end - (long)ppcVar17 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar17) & 0xfe) == 0x18) {
        ppcVar17 = (char **)(ptr + 3);
        lVar9 = uVar8 - 3;
        while( true ) {
          if (lVar9 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar17);
          if (1 < bVar1 - 0x18) break;
          ppcVar17 = (char **)((long)ppcVar17 + 1);
          lVar9 = lVar9 + -1;
        }
        if (bVar1 == 0x12) {
          ppcVar18 = (char **)((long)ppcVar17 + 1);
          goto LAB_0044a272;
        }
      }
    }
    else if (*(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar17) == '\x19') {
      lVar9 = uVar8 - 2;
      ppcVar18 = (char **)(ptr + 2);
      do {
        ppcVar17 = ppcVar18;
        if (lVar9 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar17);
        ppcVar18 = (char **)((long)ppcVar17 + 1);
        lVar9 = lVar9 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 == '\x12') {
LAB_0044a272:
        puVar13 = &uStack_40;
        uStack_40 = 10;
LAB_0044a27e:
        iVar16 = (int)*puVar13;
        ppcVar17 = ppcVar18;
        goto LAB_0044a2d3;
      }
    }
  }
  else {
    plVar6 = (long *)auStack_38;
    if (bVar1 == 0x16) goto LAB_0044a288;
    if (bVar1 == 5) {
      puVar11 = auStack_38;
      if (uVar8 != 1) {
        uStack_40 = 0x44a178;
        XVar7 = (*enc[3].scanners[1])(enc,ptr,(char *)0x1,ppcVar18);
        puVar12 = auStack_38;
        goto LAB_0044a276;
      }
      goto LAB_0044a210;
    }
  }
  iVar16 = 0;
LAB_0044a2d3:
  *nextTokPtr = (char *)ppcVar17;
  return iVar16;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}